

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_generator.h
# Opt level: O2

void __thiscall google::protobuf::compiler::csharp::Generator::~Generator(Generator *this)

{
  CodeGenerator::~CodeGenerator(&this->super_CodeGenerator);
  operator_delete(this,8);
  return;
}

Assistant:

class LIBPROTOC_EXPORT Generator
    : public google::protobuf::compiler::CodeGenerator {
public:
  virtual bool Generate(
      const FileDescriptor* file,
      const string& parameter,
      GeneratorContext* generator_context,
      string* error) const;
}